

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O0

int soplex::
    SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
              (Breakpoint *keys,BreakpointCompare *compare,int start,int end,int size,int start2,
              int end2,bool type)

{
  double dVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Breakpoint i;
  Breakpoint i_00;
  Breakpoint j;
  Breakpoint j_00;
  Breakpoint j_01;
  Breakpoint j_02;
  int iVar4;
  double *pdVar5;
  undefined8 *puVar6;
  int in_ECX;
  undefined8 *puVar7;
  int in_EDX;
  Breakpoint *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar8;
  int unaff_retaddr;
  undefined1 in_stack_00000010;
  int mid;
  int hi;
  int lo;
  Breakpoint tmp;
  Breakpoint pivotkey;
  int local_58;
  int local_54;
  bool bVar10;
  undefined8 in_stack_ffffffffffffffc8;
  double dVar9;
  int in_stack_ffffffffffffffd0;
  undefined3 in_stack_ffffffffffffffd4;
  uint size_00;
  int end_00;
  int iVar11;
  int local_4;
  
  size_00 = CONCAT13(in_stack_00000010,in_stack_ffffffffffffffd4) & 0x1ffffff;
  if (in_ECX < in_EDX + 1) {
    local_4 = 0;
  }
  else if (in_ECX == in_EDX + 1) {
    local_4 = 1;
  }
  else {
    local_54 = in_R9D;
    if (in_R9D < in_EDX) {
      local_54 = in_EDX;
    }
    if (local_54 + in_R8D < in_ECX + -1) {
      local_58 = in_ECX + -1;
      iVar4 = (local_54 + local_58) / 2;
      pdVar5 = (double *)(in_RDI + (long)iVar4 * 0x10);
      dVar1 = *pdVar5;
      dVar9 = pdVar5[1];
      end_00 = local_54;
      iVar11 = local_58;
      while( true ) {
        if ((size_00 & 0x1000000) == 0) {
          while( true ) {
            bVar10 = false;
            if (local_54 < iVar11) {
              j_00._8_8_ = dVar9;
              j_00.val = dVar1;
              dVar8 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                ((BreakpointCompare *)in_RSI,
                                 *(Breakpoint *)(in_RDI + (long)local_54 * 0x10),j_00);
              bVar10 = dVar8 <= 0.0;
            }
            if (!bVar10) break;
            local_54 = local_54 + 1;
          }
          while( true ) {
            bVar10 = false;
            if (end_00 < local_58) {
              j._8_8_ = dVar9;
              j.val = dVar1;
              dVar8 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                ((BreakpointCompare *)in_RSI,
                                 *(Breakpoint *)(in_RDI + (long)local_58 * 0x10),j);
              bVar10 = 0.0 < dVar8;
            }
            if (!bVar10) break;
            local_58 = local_58 + -1;
          }
        }
        else {
          while( true ) {
            bVar10 = false;
            if (local_54 < iVar11) {
              j_02._8_8_ = dVar9;
              j_02.val = dVar1;
              dVar8 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                ((BreakpointCompare *)in_RSI,
                                 *(Breakpoint *)(in_RDI + (long)local_54 * 0x10),j_02);
              bVar10 = dVar8 < 0.0;
            }
            if (!bVar10) break;
            local_54 = local_54 + 1;
          }
          while( true ) {
            bVar10 = false;
            if (end_00 < local_58) {
              j_01._8_8_ = dVar9;
              j_01.val = dVar1;
              dVar8 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                                ((BreakpointCompare *)in_RSI,
                                 *(Breakpoint *)(in_RDI + (long)local_58 * 0x10),j_01);
              bVar10 = 0.0 <= dVar8;
            }
            if (!bVar10) break;
            local_58 = local_58 + -1;
          }
        }
        if (local_58 <= local_54) break;
        puVar6 = (undefined8 *)(in_RDI + (long)local_54 * 0x10);
        uVar2 = *puVar6;
        uVar3 = puVar6[1];
        puVar7 = (undefined8 *)(in_RDI + (long)local_58 * 0x10);
        puVar6 = (undefined8 *)(in_RDI + (long)local_54 * 0x10);
        *puVar6 = *puVar7;
        puVar6[1] = puVar7[1];
        puVar6 = (undefined8 *)(in_RDI + (long)local_58 * 0x10);
        *puVar6 = uVar2;
        puVar6[1] = uVar3;
        local_54 = local_54 + 1;
        local_58 = local_58 + -1;
      }
      if ((size_00 & 0x1000000) == 0) {
        while( true ) {
          bVar10 = false;
          if (end_00 < local_58) {
            i._8_8_ = dVar9;
            i.val = dVar1;
            dVar8 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                              ((BreakpointCompare *)in_RSI,i,
                               *(Breakpoint *)(in_RDI + (long)local_58 * 0x10));
            bVar10 = dVar8 <= 0.0;
          }
          if (!bVar10) break;
          local_58 = local_58 + -1;
        }
        if (local_58 == iVar11) {
          puVar6 = (undefined8 *)(in_RDI + (long)local_58 * 0x10);
          uVar2 = *puVar6;
          uVar3 = puVar6[1];
          puVar7 = (undefined8 *)(in_RDI + (long)iVar4 * 0x10);
          puVar6 = (undefined8 *)(in_RDI + (long)local_58 * 0x10);
          *puVar6 = *puVar7;
          puVar6[1] = puVar7[1];
          puVar6 = (undefined8 *)(in_RDI + (long)iVar4 * 0x10);
          *puVar6 = uVar2;
          puVar6[1] = uVar3;
          local_58 = local_58 + -1;
        }
      }
      else {
        while( true ) {
          bVar10 = false;
          if (local_54 < iVar11) {
            i_00._8_8_ = dVar9;
            i_00.val = dVar1;
            dVar8 = SPxBoundFlippingRT<double>::BreakpointCompare::operator()
                              ((BreakpointCompare *)in_RSI,i_00,
                               *(Breakpoint *)(in_RDI + (long)local_54 * 0x10));
            bVar10 = 0.0 <= dVar8;
          }
          if (!bVar10) break;
          local_54 = local_54 + 1;
        }
        if (local_54 == end_00) {
          puVar6 = (undefined8 *)(in_RDI + (long)local_54 * 0x10);
          uVar2 = *puVar6;
          uVar3 = puVar6[1];
          puVar7 = (undefined8 *)(in_RDI + (long)iVar4 * 0x10);
          puVar6 = (undefined8 *)(in_RDI + (long)local_54 * 0x10);
          *puVar6 = *puVar7;
          puVar6[1] = puVar7[1];
          puVar6 = (undefined8 *)(in_RDI + (long)iVar4 * 0x10);
          *puVar6 = uVar2;
          puVar6[1] = uVar3;
          local_54 = local_54 + 1;
        }
      }
      if (local_58 - end_00 < in_R8D * 2) {
        bVar10 = SUB81((ulong)dVar9 >> 0x18,0);
        iVar4 = (int)((ulong)dVar9 >> 0x20);
        if (local_54 - end_00 < in_R8D) {
          SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                    ((Breakpoint *)CONCAT44(in_EDX,iVar11),in_R8D,
                     (BreakpointCompare *)CONCAT44(size_00,in_stack_ffffffffffffffd0),iVar4,bVar10);
          local_4 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                              (in_RSI,(BreakpointCompare *)CONCAT44(in_EDX,iVar11),in_R8D,end_00,
                               size_00,in_stack_ffffffffffffffd0,unaff_retaddr,
                               SUB81((ulong)dVar9 >> 0x38,0));
        }
        else {
          SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                    ((Breakpoint *)CONCAT44(in_EDX,iVar11),in_R8D,
                     (BreakpointCompare *)CONCAT44(size_00,in_stack_ffffffffffffffd0),iVar4,bVar10);
          local_4 = local_54 + -1;
        }
      }
      else {
        local_4 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                            (in_RSI,(BreakpointCompare *)CONCAT44(in_EDX,iVar11),in_R8D,end_00,
                             size_00,in_stack_ffffffffffffffd0,unaff_retaddr,
                             SUB81((ulong)dVar9 >> 0x38,0));
      }
    }
    else {
      SPxQuicksort<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                ((Breakpoint *)CONCAT44(in_EDX,in_ECX),in_R8D,
                 (BreakpointCompare *)
                 (CONCAT44(CONCAT13(in_stack_00000010,in_stack_ffffffffffffffd4),
                           in_stack_ffffffffffffffd0) & 0x1ffffffffffffff),
                 (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x18,0));
      local_4 = in_ECX + -1;
    }
  }
  return local_4;
}

Assistant:

int SPxQuicksortPart(T* keys, COMPARATOR& compare, int start, int end, int size, int start2 = 0,
                     int end2 = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end < start + 1)
      return 0;
   else if(end == start + 1)
      return 1;

   /* we assume that range {start, ..., start2-1} already contains the start2-start smallest elements in sorted order;
    * start2 has to lie in {start, ..., end-1} */
   if(start2 < start)
      start2 = start;

#ifdef CHECK_SORTING
   assert(start2 < end);

   for(int i = start; i < start2 - 1; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
   assert(end2 <= end);

   /* if all remaining elements should be sorted, we simply call standard quicksort */
   if(start2 + size >= end - 1)
   {
      SPxQuicksort(keys, end, compare, start2, type);
      return end - 1;
   }

   T pivotkey;
   T tmp;
   int lo;
   int hi;
   int mid;

   /* reduce end position to last element index */
   --end;

   /* select pivot element */
   mid = (start2 + end) / 2;
   pivotkey = keys[mid];

   /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
   lo = start2;
   hi = end;

   for(;;)
   {
      if(type)
      {
         while(lo < end && compare(keys[lo], pivotkey) < 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) >= 0)
            hi--;
      }
      else
      {
         while(lo < end && compare(keys[lo], pivotkey) <= 0)
            lo++;

         while(hi > start2 && compare(keys[hi], pivotkey) > 0)
            hi--;
      }

      if(lo >= hi)
         break;

      tmp = keys[lo];
      keys[lo] = keys[hi];
      keys[hi] = tmp;

      lo++;
      hi--;
   }

   assert((hi == lo - 1) || (type && hi == start2) || (!type && lo == end));

   /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
   if(type)
   {
      while(lo < end && compare(pivotkey, keys[lo]) >= 0)
         lo++;

      /* make sure that we have at least one element in the smaller partition */
      if(lo == start2)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[lo];
         keys[lo] = keys[mid];
         keys[mid] = tmp;

         lo++;
      }
   }
   else
   {
      while(hi > start2 && compare(pivotkey, keys[hi]) <= 0)
         hi--;

      /* make sure that we have at least one element in the smaller partition */
      if(hi == end)
      {
         /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
         assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

         tmp = keys[hi];
         keys[hi] = keys[mid];
         keys[mid] = tmp;

         hi--;
      }
   }

#ifdef CHECK_SORTING

   for(int i = start2; i < lo; ++i)
      assert(compare(keys[i], pivotkey) <= 0);

#endif

   /* if we only need to sort less than half of the "<" part, use partial sort again */
   if(2 * size <= hi - start2)
   {
      return SPxQuicksortPart(keys, compare, start, hi + 1, size, start2, end2, !type);
   }
   /* otherwise, and if we do not need to sort the ">" part, use standard quicksort on the "<" part */
   else if(size <= lo - start2)
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return lo - 1;
   }
   /* otherwise we have to sort the "<" part fully (use standard quicksort) and the ">" part partially */
   else
   {
      SPxQuicksort(keys, hi + 1, compare, start2, !type);
      return SPxQuicksortPart(keys, compare, start, end + 1, size + start2 - lo, lo, end2, !type);
   }
}